

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

void hd_context_shrink_table_size(nghttp2_hd_context *context,nghttp2_hd_map *map)

{
  nghttp2_mem *mem;
  size_t sVar1;
  nghttp2_hd_entry *ent;
  
  mem = context->mem;
  while ((context->hd_table_bufsize_max < context->hd_table_bufsize &&
         (sVar1 = (context->hd_table).len, sVar1 != 0))) {
    ent = hd_ringbuf_get(&context->hd_table,sVar1 - 1);
    context->hd_table_bufsize =
         (context->hd_table_bufsize - (((ent->nv).name)->len + ((ent->nv).value)->len)) - 0x20;
    hd_ringbuf_pop_back(&context->hd_table);
    if (map != (nghttp2_hd_map *)0x0) {
      hd_map_remove(map,ent);
    }
    nghttp2_hd_entry_free(ent);
    nghttp2_mem_free(mem,ent);
  }
  return;
}

Assistant:

static void hd_context_shrink_table_size(nghttp2_hd_context *context,
                                         nghttp2_hd_map *map) {
  nghttp2_mem *mem;

  mem = context->mem;

  while (context->hd_table_bufsize > context->hd_table_bufsize_max &&
         context->hd_table.len > 0) {
    size_t idx = context->hd_table.len - 1;
    nghttp2_hd_entry *ent = hd_ringbuf_get(&context->hd_table, idx);
    context->hd_table_bufsize -=
        entry_room(ent->nv.name->len, ent->nv.value->len);
    hd_ringbuf_pop_back(&context->hd_table);
    if (map) {
      hd_map_remove(map, ent);
    }

    nghttp2_hd_entry_free(ent);
    nghttp2_mem_free(mem, ent);
  }
}